

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

int tnt_iter_array_next(tnt_iter *i)

{
  tnt_iter_array *itr;
  tnt_iter *i_local;
  
  (i->data).array.cur_index = (i->data).array.cur_index + 1;
  if ((uint)(i->data).array.cur_index < (i->data).array.elem_count) {
    if ((i->data).array.cur_index == 0) {
      (i->data).array.elem = (i->data).array.first_elem;
    }
    else {
      (i->data).array.elem = (i->data).array.elem_end;
    }
    (i->data).array.elem_end = (i->data).array.elem;
    mp_next(&(i->data).array.elem_end);
    i_local._4_4_ = 1;
  }
  else {
    i->status = TNT_ITER_FAIL;
    i_local._4_4_ = 0;
  }
  return i_local._4_4_;
}

Assistant:

static int tnt_iter_array_next(struct tnt_iter *i) {
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->elem_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->elem = itr->first_elem;
	else
		itr->elem = itr->elem_end;
	itr->elem_end = itr->elem;
	mp_next(&itr->elem_end);
	return 1;
}